

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

int MatchFinder_Create(CMatchFinder *p,UInt32 historySize,UInt32 keepAddBufferBefore,
                      UInt32 matchMaxLen,UInt32 keepAddBufferAfter,ISzAllocPtr alloc)

{
  byte bVar1;
  uint uVar2;
  UInt32 UVar3;
  uint uVar4;
  Byte *pBVar5;
  CLzRef *pCVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar2 = historySize + keepAddBufferBefore + 1;
  p->keepSizeBefore = uVar2;
  uVar4 = keepAddBufferAfter + matchMaxLen;
  if (keepAddBufferAfter + matchMaxLen <= p->numHashBytes) {
    uVar4 = p->numHashBytes;
  }
  p->keepSizeAfter = uVar4;
  if (p->directInput == '\0') {
    uVar9 = uVar4 + uVar2;
    if (uVar2 < historySize || CARRY4(uVar4,uVar2)) goto LAB_001698a7;
    uVar2 = uVar9 >> (2U - (uVar9 < 0x40000000) & 0x1f);
    uVar4 = uVar2 + uVar9 + 0x11080 & 0xffff0000;
    if (-uVar9 - 0x10000 <= uVar2 + 0x11080) {
      uVar4 = 0xffff0000;
    }
    if (((0xfffeffff < uVar9) || (-uVar9 - 0x10000 < 0x1000000)) || (uVar4 == 0)) goto LAB_001698a7;
    if ((p->bufBase == (Byte *)0x0) || (p->blockSize != uVar4)) {
      (*alloc->Free)(alloc,p->bufBase);
      p->bufBase = (Byte *)0x0;
      p->blockSize = uVar4;
      pBVar5 = (Byte *)(*alloc->Alloc)(alloc,(ulong)uVar4);
      p->bufBase = pBVar5;
      if (pBVar5 == (Byte *)0x0) goto LAB_001698a7;
    }
  }
  else {
    p->blockSize = 0;
  }
  bVar1 = p->numHashOutBits;
  if (bVar1 == 0) {
    uVar4 = MatchFinder_GetHashMask(p,historySize);
    uVar10 = (ulong)uVar4;
    if ((ulong)historySize <= p->expectedDataSize) goto LAB_001697e8;
    UVar3 = MatchFinder_GetHashMask(p,(UInt32)p->expectedDataSize);
    if (UVar3 < uVar4) {
      uVar4 = UVar3;
    }
  }
  else {
    uVar4 = p->numHashBytes;
    bVar7 = 0x10;
    if (uVar4 != 2) {
      bVar7 = (uVar4 != 3) * '\b' + 0x18;
    }
    if (bVar1 <= bVar7) {
      bVar7 = bVar1;
    }
    uVar2 = ~(-1 << (bVar7 & 0x1f)) | 0xffff;
    if (0x1f < bVar7) {
      uVar2 = 0xffffffff;
    }
    uVar9 = uVar2 | 0x3ffff;
    if (uVar4 < 5) {
      uVar9 = uVar2;
    }
    UVar3 = MatchFinder_GetHashMask2(p,historySize);
    if (UVar3 <= uVar9) {
      uVar9 = UVar3;
    }
    uVar10 = (ulong)uVar9;
    if (p->expectedDataSize < (ulong)historySize) {
      uVar4 = MatchFinder_GetHashMask2(p,(UInt32)p->expectedDataSize);
      if (uVar9 < uVar4) {
        uVar4 = uVar9;
      }
    }
    else {
LAB_001697e8:
      uVar4 = (uint)uVar10;
    }
  }
  uVar2 = historySize + 1;
  p->hashMask = uVar4;
  uVar4 = 0;
  if (2 < p->numHashBytes) {
    uVar4 = (uint)(p->numHashBytes_Min < 3) << 10;
    if (p->numHashBytes != 3) {
      uVar4 = uVar4 | 0x10000;
      if (3 < p->numHashBytes_Min) {
        uVar4 = 0;
      }
    }
  }
  p->fixedHashSize = uVar4;
  p->matchMaxLen = matchMaxLen;
  p->historySize = historySize;
  p->cyclicBufferSize = uVar2;
  uVar8 = (ulong)uVar2 << (p->btMode != '\0');
  if (uVar8 < uVar2) {
    return 0;
  }
  lVar11 = (ulong)uVar4 + uVar10 + 1;
  uVar10 = lVar11 + uVar8 + 0xf & 0xfffffffffffffff0;
  if ((p->hash != (CLzRef *)0x0) && (uVar10 <= p->numRefs)) {
    return 1;
  }
  (*alloc->Free)(alloc,p->hash);
  p->hash = (CLzRef *)0x0;
  p->numRefs = uVar10;
  pCVar6 = (CLzRef *)(*alloc->Alloc)(alloc,uVar10 << 2);
  p->hash = pCVar6;
  if (pCVar6 != (CLzRef *)0x0) {
    p->son = pCVar6 + lVar11;
    return 1;
  }
LAB_001698a7:
  MatchFinder_Free(p,alloc);
  return 0;
}

Assistant:

int MatchFinder_Create(CMatchFinder *p, UInt32 historySize,
    UInt32 keepAddBufferBefore, UInt32 matchMaxLen, UInt32 keepAddBufferAfter,
    ISzAllocPtr alloc)
{
  /* we need one additional byte in (p->keepSizeBefore),
     since we use MoveBlock() after (p->pos++) and before dictionary using */
  // keepAddBufferBefore = (UInt32)0xFFFFFFFF - (1 << 22); // for debug
  p->keepSizeBefore = historySize + keepAddBufferBefore + 1;

  keepAddBufferAfter += matchMaxLen;
  /* we need (p->keepSizeAfter >= p->numHashBytes) */
  if (keepAddBufferAfter < p->numHashBytes)
    keepAddBufferAfter = p->numHashBytes;
  // keepAddBufferAfter -= 2; // for debug
  p->keepSizeAfter = keepAddBufferAfter;

  if (p->directInput)
    p->blockSize = 0;
  if (p->directInput || LzInWindow_Create2(p, GetBlockSize(p, historySize), alloc))
  {
    size_t hashSizeSum;
    {
      UInt32 hs;
      UInt32 hsCur;
      
      if (p->numHashOutBits != 0)
      {
        unsigned numBits = p->numHashOutBits;
        const unsigned nbMax =
            (p->numHashBytes == 2 ? 16 :
            (p->numHashBytes == 3 ? 24 : 32));
        if (numBits > nbMax)
          numBits = nbMax;
        if (numBits >= 32)
          hs = (UInt32)0 - 1;
        else
          hs = ((UInt32)1 << numBits) - 1;
        // (hash_size >= (1 << 16)) : Required for (numHashBytes > 2)
        hs |= (1 << 16) - 1; /* don't change it! */
        if (p->numHashBytes >= 5)
          hs |= (256 << kLzHash_CrcShift_2) - 1;
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, historySize);
          if (hs > hs2)
            hs = hs2;
        }
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          const UInt32 hs2 = MatchFinder_GetHashMask2(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs2)
            hsCur = hs2;
        }
      }
      else
      {
        hs = MatchFinder_GetHashMask(p, historySize);
        hsCur = hs;
        if (p->expectedDataSize < historySize)
        {
          hsCur = MatchFinder_GetHashMask(p, (UInt32)p->expectedDataSize);
          if (hsCur > hs) // is it possible?
            hsCur = hs;
        }
      }

      p->hashMask = hsCur;

      hashSizeSum = hs;
      hashSizeSum++;
      if (hashSizeSum < hs)
        return 0;
      {
        UInt32 fixedHashSize = 0;
        if (p->numHashBytes > 2 && p->numHashBytes_Min <= 2) fixedHashSize += kHash2Size;
        if (p->numHashBytes > 3 && p->numHashBytes_Min <= 3) fixedHashSize += kHash3Size;
        // if (p->numHashBytes > 4) p->fixedHashSize += hs4; // kHash4Size;
        hashSizeSum += fixedHashSize;
        p->fixedHashSize = fixedHashSize;
      }
    }

    p->matchMaxLen = matchMaxLen;

    {
      size_t newSize;
      size_t numSons;
      const UInt32 newCyclicBufferSize = historySize + 1; // do not change it
      p->historySize = historySize;
      p->cyclicBufferSize = newCyclicBufferSize; // it must be = (historySize + 1)
      
      numSons = newCyclicBufferSize;
      if (p->btMode)
        numSons <<= 1;
      newSize = hashSizeSum + numSons;

      if (numSons < newCyclicBufferSize || newSize < numSons)
        return 0;

      // aligned size is not required here, but it can be better for some loops
      #define NUM_REFS_ALIGN_MASK 0xF
      newSize = (newSize + NUM_REFS_ALIGN_MASK) & ~(size_t)NUM_REFS_ALIGN_MASK;

      // 22.02: we don't reallocate buffer, if old size is enough
      if (p->hash && p->numRefs >= newSize)
        return 1;
      
      MatchFinder_FreeThisClassMemory(p, alloc);
      p->numRefs = newSize;
      p->hash = AllocRefs(newSize, alloc);
      
      if (p->hash)
      {
        p->son = p->hash + hashSizeSum;
        return 1;
      }
    }
  }

  MatchFinder_Free(p, alloc);
  return 0;
}